

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O1

void __thiscall wasm::UnneededSetRemover::visitLocalSet(UnneededSetRemover *this,LocalSet *curr)

{
  bool bVar1;
  Expression *pEVar2;
  
  if ((this->localGetCounter->num).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[curr->index] == 0) {
    remove(this,(char *)curr);
  }
  pEVar2 = curr->value;
  do {
    bVar1 = true;
    if (pEVar2->_id == LocalGetId) {
      if (*(Index *)(pEVar2 + 1) == curr->index) {
LAB_009c297b:
        remove(this,(char *)curr);
      }
    }
    else if (pEVar2->_id == LocalSetId) {
      if (*(Index *)(pEVar2 + 1) == curr->index) goto LAB_009c297b;
      pEVar2 = (Expression *)pEVar2[1].type.id;
      bVar1 = false;
    }
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    // If no possible uses, remove.
    if (localGetCounter->num[curr->index] == 0) {
      remove(curr);
    }
    // If setting the same value as we already have, remove.
    auto* value = curr->value;
    while (true) {
      if (auto* set = value->dynCast<LocalSet>()) {
        if (set->index == curr->index) {
          remove(curr);
        } else {
          // Handle tee chains.
          value = set->value;
          continue;
        }
      } else if (auto* get = value->dynCast<LocalGet>()) {
        if (get->index == curr->index) {
          remove(curr);
        }
      }
      break;
    }
  }